

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O0

void * cmCreateSourceFile(void)

{
  cmCPluginAPISourceFile *this;
  
  this = (cmCPluginAPISourceFile *)operator_new(0xb0);
  cmCPluginAPISourceFile::cmCPluginAPISourceFile(this);
  return this;
}

Assistant:

void * CCONV cmCreateSourceFile(void)
{
  return (void*)new cmCPluginAPISourceFile;
}